

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_map.hpp
# Opt level: O2

void run<std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>>
               (vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                *A,vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                   *B)

{
  mapped_type *pmVar1;
  _Base_ptr p_Var2;
  pointer pmVar3;
  ulong uVar4;
  key_type local_3c;
  _Base_ptr local_38;
  
  std::
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  ::resize(B,((long)(A->
                    super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(A->
                   super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x30);
  pmVar3 = (A->
           super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)(A->
                             super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3) / 0x30);
      uVar4 = uVar4 + 1) {
    p_Var2 = *(_Base_ptr *)((long)&pmVar3[uVar4]._M_t._M_impl.super__Rb_tree_header + 0x10);
    while (p_Var2 != &pmVar3[uVar4]._M_t._M_impl.super__Rb_tree_header._M_header) {
      local_38 = p_Var2[1]._M_parent;
      local_3c = (key_type)uVar4;
      pmVar1 = std::
               map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
               ::operator[]((B->
                            super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + p_Var2[1]._M_color,
                            &local_3c);
      *pmVar1 = (mapped_type)local_38;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      pmVar3 = (A->
               super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
  }
  do_nothing(B);
  return;
}

Assistant:

void run(std::vector<RowType1> const & A,
         std::vector<RowType2> & B)
{
  B.resize(A.size());

  for (std::size_t i=0; i<A.size(); ++i)
    for (typename RowType1::const_iterator it = A[i].begin(); it != A[i].end(); ++it)
      B[it->first][i] = it->second;

  do_nothing(B);
}